

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

NavigationState * __thiscall
despot::MemoryPool<despot::NavigationState>::Allocate(MemoryPool<despot::NavigationState> *this)

{
  NavigationState *pNVar1;
  pointer ppNVar2;
  
  ppNVar2 = (this->freelist_).
            super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->freelist_).
      super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
      _M_impl.super__Vector_impl_data._M_start == ppNVar2) {
    NewChunk(this);
    ppNVar2 = (this->freelist_).
              super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  pNVar1 = ppNVar2[-1];
  (this->freelist_).
  super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppNVar2 + -1;
  if (pNVar1->field_0x8 != '\x01') {
    pNVar1->field_0x8 = 1;
    this->num_allocated_ = this->num_allocated_ + 1;
    return pNVar1;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,
                "T *despot::MemoryPool<despot::NavigationState>::Allocate() [T = despot::NavigationState]"
               );
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}